

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ushort uVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  Command *pCVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  long lVar11;
  ulong uVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  ulong uVar15;
  ulong uVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  uint32_t uVar22;
  size_t sVar23;
  int *piVar24;
  BrotliEncoderDictionary *pBVar25;
  uint8_t *local_d88;
  uint8_t *local_d78;
  uint8_t *local_d68;
  uint8_t *local_d60;
  uint8_t *local_d50;
  uint8_t *local_d38;
  uint8_t *local_d30;
  ulong local_d28;
  ulong local_d20;
  uint8_t *local_d18;
  uint8_t *local_d10;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_ca0;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t max_backward_limit;
  HasherHandle hasher_local;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_b40;
  uint32_t delta_4;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist_2;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_a2a;
  uint32_t nbits_2;
  ushort local_a02;
  int offset_3;
  uint16_t bits64;
  ushort local_9da;
  int next_last_distance_1;
  int last_distance_1;
  int next_last_distance;
  int last_distance;
  size_t score_4;
  size_t len_4;
  size_t last_1;
  size_t prev_ix_3;
  size_t slot_1;
  size_t delta_2;
  size_t hops_1;
  size_t backward_4;
  size_t bank_2;
  size_t score_3;
  size_t len_3;
  size_t prev_ix_2;
  size_t backward_3;
  uint8_t tiny_hash_1;
  size_t key_3;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t cur_ix_masked_1;
  H42 *self_3;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_860;
  size_t local_850;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_820;
  size_t local_810;
  int item_matches_1;
  size_t item_1;
  HasherCommon *self_5;
  size_t i_3;
  size_t key_5;
  uint32_t h_5;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_5;
  size_t backward_5;
  size_t matchlen_1;
  size_t offset_1;
  size_t dist_1;
  size_t len_5;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_680;
  size_t local_670;
  size_t score_1;
  size_t len_1;
  size_t last;
  size_t prev_ix_1;
  size_t slot;
  size_t delta;
  size_t hops;
  size_t backward_1;
  size_t bank;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  uint8_t tiny_hash;
  size_t key;
  size_t i;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t cur_ix_masked;
  H42 *self;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_4f8;
  size_t local_4e8;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_4b8;
  size_t local_4a8;
  int item_matches;
  size_t item;
  HasherCommon *self_2;
  size_t i_1;
  size_t key_2;
  uint32_t h_2;
  size_t transform_id;
  size_t cut;
  size_t score_2;
  size_t backward_2;
  size_t matchlen;
  size_t offset;
  size_t dist;
  size_t len_2;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_318;
  size_t local_308;
  uint8_t *local_2b8;
  size_t i_4;
  ulong local_288;
  size_t delta_5;
  size_t idx_2;
  size_t bank_4;
  size_t key_6;
  H42 *self_6;
  ulong local_240;
  size_t delta_1;
  size_t idx;
  size_t bank_1;
  size_t key_1;
  H42 *self_1;
  ulong local_1f8;
  size_t delta_3;
  size_t idx_1;
  size_t bank_3;
  size_t key_4;
  H42 *self_4;
  ulong local_1b0;
  size_t delta_7;
  size_t idx_4;
  size_t bank_6;
  size_t key_8;
  H42 *self_8;
  ulong local_168;
  size_t delta_6;
  size_t idx_3;
  size_t bank_5;
  size_t key_7;
  H42 *self_7;
  uint32_t h_7;
  uint32_t h_8;
  uint32_t h_4;
  uint32_t h_1;
  uint32_t h_6;
  uint32_t h;
  uint32_t h_3;
  
  pCVar5 = commands;
  puVar9 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  pos_end = *last_insert_len;
  puVar10 = (uint8_t *)(position + num_bytes);
  local_d10 = (uint8_t *)position;
  if (3 < num_bytes) {
    local_d10 = (uint8_t *)((position + num_bytes) - 3);
  }
  iVar8 = 0x200;
  if (params->quality < 9) {
    iVar8 = 0x40;
  }
  lVar11 = (long)iVar8;
  gap = position + lVar11;
  iVar8 = *dist_cache;
  dist_cache[4] = iVar8 + -1;
  dist_cache[5] = iVar8 + 1;
  dist_cache[6] = iVar8 + -2;
  dist_cache[7] = iVar8 + 2;
  dist_cache[8] = iVar8 + -3;
  dist_cache[9] = iVar8 + 3;
  iVar8 = dist_cache[1];
  dist_cache[10] = iVar8 + -1;
  dist_cache[0xb] = iVar8 + 1;
  dist_cache[0xc] = iVar8 + -2;
  dist_cache[0xd] = iVar8 + 2;
  dist_cache[0xe] = iVar8 + -3;
  dist_cache[0xf] = iVar8 + 3;
  puVar18 = (uint8_t *)position;
LAB_00118eb9:
  do {
    ringbuffer_local = puVar18;
    if (puVar10 <= ringbuffer_local + 4) {
      *last_insert_len = (size_t)(puVar10 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar5 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar10 - (long)ringbuffer_local;
    local_d18 = puVar9;
    if (ringbuffer_local < puVar9) {
      local_d18 = ringbuffer_local;
    }
    sr.score = 0;
    sr.len = 0;
    sr.distance = 0x7e4;
    pBVar25 = &params->dictionary;
    puVar18 = (uint8_t *)(params->dist).max_distance;
    uVar12 = (ulong)ringbuffer_local & ringbuffer_mask;
    best_len = 0x7e4;
    i = 0;
    uVar6 = (uint)(*(int *)(ringbuffer + uVar12) * 0x1e35a7bd) >> 0x11;
    uVar19 = (ulong)uVar6;
    sStack_ca0 = 0;
    sr.score._0_4_ = 0;
    for (key = 0; key < 0x10; key = key + 1) {
      puVar13 = (uint8_t *)(long)dist_cache[key];
      puVar14 = ringbuffer_local + -(long)puVar13;
      if ((((key == 0) || (hasher[((ulong)puVar14 & 0xffff) + 0x30028] == (uint8_t)uVar6)) &&
          (puVar14 < ringbuffer_local)) && (puVar13 <= local_d18)) {
        uVar15 = ringbuffer_mask & (ulong)puVar14;
        local_4b8 = (ulong *)(ringbuffer + uVar12);
        limit2 = 0;
        x = (max_distance >> 3) + 1;
LAB_001191e9:
        x = x - 1;
        if (x != 0) {
          if (*local_4b8 == *(ulong *)(ringbuffer + limit2 + uVar15)) goto LAB_0011924b;
          iVar8 = 0;
          for (uVar15 = *local_4b8 ^ *(ulong *)(ringbuffer + limit2 + uVar15); (uVar15 & 1) == 0;
              uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            iVar8 = iVar8 + 1;
          }
          local_4a8 = ((ulong)(long)iVar8 >> 3) + limit2;
          goto LAB_0011938c;
        }
        matched = (max_distance & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (ringbuffer[limit2 + uVar15] != (uint8_t)*local_4b8) {
            local_4a8 = limit2;
            goto LAB_0011938c;
          }
          local_4b8 = (ulong *)((long)local_4b8 + 1);
          limit2 = limit2 + 1;
        }
        local_4a8 = limit2;
LAB_0011938c:
        if ((1 < local_4a8) && (bank = local_4a8 * 0x87 + 0x78f, best_len < bank)) {
          if (key != 0) {
            bank = bank - ((long)(int)(0x1ca10 >> ((byte)key & 0xe) & 0xe) + 0x27);
          }
          if (best_len < bank) {
            best_len = bank;
            i = local_4a8;
            sStack_ca0 = local_4a8;
            sr.distance = bank;
            sr.len = (size_t)puVar13;
          }
        }
      }
    }
    hops = 0;
    slot = (long)ringbuffer_local - (ulong)*(uint *)(hasher + uVar19 * 4 + 0x28);
    prev_ix_1 = (ulong)*(ushort *)(hasher + uVar19 * 2 + 0x20028);
    delta = *(size_t *)(hasher + 0x140428);
    while ((sVar23 = delta - 1, delta != 0 && (hops = slot + hops, hops <= local_d18))) {
      uVar15 = (long)ringbuffer_local - hops & ringbuffer_mask;
      uVar16 = (ulong)*(ushort *)(hasher + prev_ix_1 * 4 + (uVar19 & 0x1ff) * 0x800 + 0x4002a);
      slot = (size_t)*(ushort *)(hasher + prev_ix_1 * 4 + (uVar19 & 0x1ff) * 0x800 + 0x40028);
      prev_ix_1 = uVar16;
      delta = sVar23;
      if ((uVar12 + i <= ringbuffer_mask) &&
         ((uVar15 + i <= ringbuffer_mask && (ringbuffer[uVar12 + i] == ringbuffer[uVar15 + i])))) {
        local_4f8 = (ulong *)(ringbuffer + uVar12);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_001196ae:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_4f8 == *(ulong *)(ringbuffer + limit2_1 + uVar15)) goto LAB_00119710;
          iVar8 = 0;
          for (uVar15 = *local_4f8 ^ *(ulong *)(ringbuffer + limit2_1 + uVar15); (uVar15 & 1) == 0;
              uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            iVar8 = iVar8 + 1;
          }
          local_4e8 = ((ulong)(long)iVar8 >> 3) + limit2_1;
          goto LAB_00119851;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar15] != (uint8_t)*local_4f8) {
            local_4e8 = limit2_1;
            goto LAB_00119851;
          }
          local_4f8 = (ulong *)((long)local_4f8 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_4e8 = limit2_1;
LAB_00119851:
        if (3 < local_4e8) {
          iVar8 = 0x1f;
          if ((uint)hops != 0) {
            for (; (uint)hops >> iVar8 == 0; iVar8 = iVar8 + -1) {
            }
          }
          uVar15 = (local_4e8 * 0x87 + 0x780) - (ulong)(uint)(iVar8 * 0x1e);
          if (best_len < uVar15) {
            i = local_4e8;
            sStack_ca0 = local_4e8;
            sr.len = hops;
            sr.distance = uVar15;
            best_len = uVar15;
          }
        }
      }
    }
    uVar6 = (uint)(*(int *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) * 0x1e35a7bd)
            >> 0x11;
    uVar19 = (ulong)uVar6;
    uVar15 = uVar19 & 0x1ff;
    uVar1 = *(ushort *)(hasher + uVar15 * 2 + 0x140028);
    *(ushort *)(hasher + uVar15 * 2 + 0x140028) = uVar1 + 1;
    uVar7 = uVar1 & 0x1ff;
    local_240 = (long)ringbuffer_local - (ulong)*(uint *)(hasher + uVar19 * 4 + 0x28);
    hasher[((ulong)ringbuffer_local & 0xffff) + 0x30028] = (uint8_t)uVar6;
    if (0xffff < local_240) {
      local_240 = 0xffff;
    }
    *(short *)(hasher + (long)(int)uVar7 * 4 + uVar15 * 0x800 + 0x40028) = (short)local_240;
    *(undefined2 *)(hasher + (long)(int)uVar7 * 4 + uVar15 * 0x800 + 0x4002a) =
         *(undefined2 *)(hasher + uVar19 * 2 + 0x20028);
    *(int *)(hasher + uVar19 * 4 + 0x28) = (int)ringbuffer_local;
    *(short *)(hasher + uVar19 * 2 + 0x20028) = (short)uVar7;
    if ((sr.distance == 0x7e4) &&
       (piVar24 = (int *)(ringbuffer + uVar12),
       *(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20))) {
      i_1 = (size_t)(((uint)(*piVar24 * 0x1e35a7bd) >> 0x12) << 1);
      for (self_2 = (HasherCommon *)0x0; self_2 < (HasherCommon *)0x2;
          self_2 = (HasherCommon *)((long)&(self_2->params).type + 1)) {
        uVar1 = (params->dictionary).hash_table[i_1];
        uVar12 = (ulong)uVar1;
        *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
        if (uVar12 != 0) {
          uVar19 = uVar12 & 0x1f;
          uVar15 = (ulong)(uVar1 >> 5);
          if (max_distance < uVar19) {
            bVar4 = false;
          }
          else {
            local_318 = (ulong *)(pBVar25->words->data +
                                 (ulong)pBVar25->words->offsets_by_length[uVar19] + uVar19 * uVar15)
            ;
            limit2_2 = 0;
            x_2 = (uVar19 >> 3) + 1;
LAB_00119dd6:
            x_2 = x_2 - 1;
            if (x_2 != 0) {
              if (*local_318 == *(ulong *)((long)piVar24 + limit2_2)) goto LAB_00119e38;
              iVar8 = 0;
              for (uVar12 = *local_318 ^ *(ulong *)((long)piVar24 + limit2_2); (uVar12 & 1) == 0;
                  uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                iVar8 = iVar8 + 1;
              }
              local_308 = ((ulong)(long)iVar8 >> 3) + limit2_2;
              goto LAB_00119f79;
            }
            matched_2 = (uVar12 & 7) + 1;
            while (matched_2 = matched_2 - 1, matched_2 != 0) {
              if (*(char *)((long)piVar24 + limit2_2) != (char)*local_318) {
                local_308 = limit2_2;
                goto LAB_00119f79;
              }
              local_318 = (ulong *)((long)local_318 + 1);
              limit2_2 = limit2_2 + 1;
            }
            local_308 = limit2_2;
LAB_00119f79:
            if ((uVar19 < local_308 + (params->dictionary).cutoffTransformsCount) &&
               (local_308 != 0)) {
              puVar13 = local_d18 +
                        ((uVar19 - local_308) * 4 +
                         ((params->dictionary).cutoffTransforms >>
                          ((char)(uVar19 - local_308) * '\x06' & 0x3fU) & 0x3f) <<
                        (pBVar25->words->size_bits_by_length[uVar19] & 0x3f)) + uVar15 + 1;
              if (puVar18 < puVar13) {
                bVar4 = false;
              }
              else {
                iVar8 = 0x1f;
                if ((uint)puVar13 != 0) {
                  for (; (uint)puVar13 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                  }
                }
                uVar12 = (local_308 * 0x87 + 0x780) - (ulong)(uint)(iVar8 * 0x1e);
                if (uVar12 < sr.distance) {
                  bVar4 = false;
                }
                else {
                  sStack_ca0 = local_308;
                  sr.score._0_4_ = (int)uVar19 - (int)local_308;
                  bVar4 = true;
                  sr.len = (size_t)puVar13;
                  sr.distance = uVar12;
                }
              }
            }
            else {
              bVar4 = false;
            }
          }
          if (bVar4) {
            *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
          }
        }
        i_1 = i_1 + 1;
      }
    }
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      do {
        max_distance = max_distance - 1;
        if (params->quality < 5) {
          local_d20 = sStack_ca0 - 1;
          if (max_distance <= local_d20) {
            local_d20 = max_distance;
          }
          local_d28 = local_d20;
        }
        else {
          local_d28 = 0;
        }
        sr2.len = 0;
        sr2.distance = 0x7e4;
        local_d30 = puVar9;
        if (ringbuffer_local + 1 < puVar9) {
          local_d30 = ringbuffer_local + 1;
        }
        pBVar25 = &params->dictionary;
        puVar13 = ringbuffer_local + 1;
        puVar18 = (uint8_t *)(params->dist).max_distance;
        uVar12 = (ulong)puVar13 & ringbuffer_mask;
        best_len_1 = 0x7e4;
        i_2 = local_d28;
        uVar6 = (uint)(*(int *)(ringbuffer + uVar12) * 0x1e35a7bd) >> 0x11;
        uVar19 = (ulong)uVar6;
        distance_code = 0;
        sr2.score._0_4_ = 0;
        for (key_3 = 0; key_3 < 0x10; key_3 = key_3 + 1) {
          puVar14 = (uint8_t *)(long)dist_cache[key_3];
          puVar17 = puVar13 + -(long)puVar14;
          if ((((key_3 == 0) || (hasher[((ulong)puVar17 & 0xffff) + 0x30028] == (uint8_t)uVar6)) &&
              (puVar17 < puVar13)) && (puVar14 <= local_d30)) {
            uVar15 = ringbuffer_mask & (ulong)puVar17;
            local_820 = (ulong *)(ringbuffer + uVar12);
            limit2_3 = 0;
            x_3 = (max_distance >> 3) + 1;
LAB_0011a549:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              if (*local_820 == *(ulong *)(ringbuffer + limit2_3 + uVar15)) goto LAB_0011a5ab;
              iVar8 = 0;
              for (uVar15 = *local_820 ^ *(ulong *)(ringbuffer + limit2_3 + uVar15);
                  (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                iVar8 = iVar8 + 1;
              }
              local_810 = ((ulong)(long)iVar8 >> 3) + limit2_3;
              goto LAB_0011a6ec;
            }
            matched_3 = (max_distance & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (ringbuffer[limit2_3 + uVar15] != (uint8_t)*local_820) {
                local_810 = limit2_3;
                goto LAB_0011a6ec;
              }
              local_820 = (ulong *)((long)local_820 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_810 = limit2_3;
LAB_0011a6ec:
            if ((1 < local_810) && (bank_2 = local_810 * 0x87 + 0x78f, best_len_1 < bank_2)) {
              if (key_3 != 0) {
                bank_2 = bank_2 - ((long)(int)(0x1ca10 >> ((byte)key_3 & 0xe) & 0xe) + 0x27);
              }
              if (best_len_1 < bank_2) {
                best_len_1 = bank_2;
                i_2 = local_810;
                distance_code = local_810;
                sr2.distance = bank_2;
                sr2.len = (size_t)puVar14;
              }
            }
          }
        }
        hops_1 = 0;
        slot_1 = (long)puVar13 - (ulong)*(uint *)(hasher + uVar19 * 4 + 0x28);
        prev_ix_3 = (ulong)*(ushort *)(hasher + uVar19 * 2 + 0x20028);
        delta_2 = *(size_t *)(hasher + 0x140428);
        while( true ) {
          sVar23 = delta_2 - 1;
          if ((delta_2 == 0) || (hops_1 = slot_1 + hops_1, local_d30 < hops_1)) break;
          uVar15 = (long)puVar13 - hops_1 & ringbuffer_mask;
          uVar16 = (ulong)*(ushort *)(hasher + prev_ix_3 * 4 + (uVar19 & 0x1ff) * 0x800 + 0x4002a);
          slot_1 = (size_t)*(ushort *)(hasher + prev_ix_3 * 4 + (uVar19 & 0x1ff) * 0x800 + 0x40028);
          prev_ix_3 = uVar16;
          delta_2 = sVar23;
          if (((uVar12 + i_2 <= ringbuffer_mask) && (uVar15 + i_2 <= ringbuffer_mask)) &&
             (ringbuffer[uVar12 + i_2] == ringbuffer[uVar15 + i_2])) {
            local_860 = (ulong *)(ringbuffer + uVar12);
            limit2_4 = 0;
            x_4 = (max_distance >> 3) + 1;
LAB_0011aa0e:
            x_4 = x_4 - 1;
            if (x_4 != 0) {
              if (*local_860 == *(ulong *)(ringbuffer + limit2_4 + uVar15)) goto LAB_0011aa70;
              iVar8 = 0;
              for (uVar15 = *local_860 ^ *(ulong *)(ringbuffer + limit2_4 + uVar15);
                  (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                iVar8 = iVar8 + 1;
              }
              local_850 = ((ulong)(long)iVar8 >> 3) + limit2_4;
              goto LAB_0011abb1;
            }
            matched_4 = (max_distance & 7) + 1;
            while (matched_4 = matched_4 - 1, matched_4 != 0) {
              if (ringbuffer[limit2_4 + uVar15] != (uint8_t)*local_860) {
                local_850 = limit2_4;
                goto LAB_0011abb1;
              }
              local_860 = (ulong *)((long)local_860 + 1);
              limit2_4 = limit2_4 + 1;
            }
            local_850 = limit2_4;
LAB_0011abb1:
            if (3 < local_850) {
              iVar8 = 0x1f;
              if ((uint)hops_1 != 0) {
                for (; (uint)hops_1 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                }
              }
              uVar15 = (local_850 * 0x87 + 0x780) - (ulong)(uint)(iVar8 * 0x1e);
              if (best_len_1 < uVar15) {
                i_2 = local_850;
                distance_code = local_850;
                sr2.len = hops_1;
                sr2.distance = uVar15;
                best_len_1 = uVar15;
              }
            }
          }
        }
        uVar6 = (uint)(*(int *)(ringbuffer + ((ulong)puVar13 & ringbuffer_mask)) * 0x1e35a7bd) >>
                0x11;
        uVar19 = (ulong)uVar6;
        uVar15 = uVar19 & 0x1ff;
        uVar1 = *(ushort *)(hasher + uVar15 * 2 + 0x140028);
        *(ushort *)(hasher + uVar15 * 2 + 0x140028) = uVar1 + 1;
        uVar7 = uVar1 & 0x1ff;
        local_1f8 = (long)puVar13 - (ulong)*(uint *)(hasher + uVar19 * 4 + 0x28);
        hasher[((ulong)puVar13 & 0xffff) + 0x30028] = (uint8_t)uVar6;
        if (0xffff < local_1f8) {
          local_1f8 = 0xffff;
        }
        *(short *)(hasher + (long)(int)uVar7 * 4 + uVar15 * 0x800 + 0x40028) = (short)local_1f8;
        *(undefined2 *)(hasher + (long)(int)uVar7 * 4 + uVar15 * 0x800 + 0x4002a) =
             *(undefined2 *)(hasher + uVar19 * 2 + 0x20028);
        *(int *)(hasher + uVar19 * 4 + 0x28) = (int)puVar13;
        *(short *)(hasher + uVar19 * 2 + 0x20028) = (short)uVar7;
        if ((sr2.distance == 0x7e4) &&
           (piVar24 = (int *)(ringbuffer + uVar12),
           *(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20))) {
          i_3 = (size_t)(((uint)(*piVar24 * 0x1e35a7bd) >> 0x12) << 1);
          for (self_5 = (HasherCommon *)0x0; self_5 < (HasherCommon *)0x2;
              self_5 = (HasherCommon *)((long)&(self_5->params).type + 1)) {
            uVar1 = (params->dictionary).hash_table[i_3];
            uVar12 = (ulong)uVar1;
            *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
            if (uVar12 != 0) {
              uVar19 = uVar12 & 0x1f;
              uVar15 = (ulong)(uVar1 >> 5);
              if (max_distance < uVar19) {
                bVar4 = false;
              }
              else {
                local_680 = (ulong *)(pBVar25->words->data +
                                     (ulong)pBVar25->words->offsets_by_length[uVar19] +
                                     uVar19 * uVar15);
                limit2_5 = 0;
                x_5 = (uVar19 >> 3) + 1;
LAB_0011b136:
                x_5 = x_5 - 1;
                if (x_5 != 0) {
                  if (*local_680 == *(ulong *)((long)piVar24 + limit2_5)) goto LAB_0011b198;
                  iVar8 = 0;
                  for (uVar12 = *local_680 ^ *(ulong *)((long)piVar24 + limit2_5); (uVar12 & 1) == 0
                      ; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                    iVar8 = iVar8 + 1;
                  }
                  local_670 = ((ulong)(long)iVar8 >> 3) + limit2_5;
                  goto LAB_0011b2d9;
                }
                matched_5 = (uVar12 & 7) + 1;
                while (matched_5 = matched_5 - 1, matched_5 != 0) {
                  if (*(char *)((long)piVar24 + limit2_5) != (char)*local_680) {
                    local_670 = limit2_5;
                    goto LAB_0011b2d9;
                  }
                  local_680 = (ulong *)((long)local_680 + 1);
                  limit2_5 = limit2_5 + 1;
                }
                local_670 = limit2_5;
LAB_0011b2d9:
                if ((uVar19 < local_670 + (params->dictionary).cutoffTransformsCount) &&
                   (local_670 != 0)) {
                  puVar13 = local_d30 +
                            ((uVar19 - local_670) * 4 +
                             ((params->dictionary).cutoffTransforms >>
                              ((char)(uVar19 - local_670) * '\x06' & 0x3fU) & 0x3f) <<
                            (pBVar25->words->size_bits_by_length[uVar19] & 0x3f)) + uVar15 + 1;
                  if (puVar18 < puVar13) {
                    bVar4 = false;
                  }
                  else {
                    iVar8 = 0x1f;
                    if ((uint)puVar13 != 0) {
                      for (; (uint)puVar13 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                      }
                    }
                    uVar12 = (local_670 * 0x87 + 0x780) - (ulong)(uint)(iVar8 * 0x1e);
                    if (uVar12 < sr2.distance) {
                      bVar4 = false;
                    }
                    else {
                      distance_code = local_670;
                      sr2.score._0_4_ = (int)uVar19 - (int)local_670;
                      bVar4 = true;
                      sr2.len = (size_t)puVar13;
                      sr2.distance = uVar12;
                    }
                  }
                }
                else {
                  bVar4 = false;
                }
              }
              if (bVar4) {
                *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
              }
            }
            i_3 = i_3 + 1;
          }
        }
        puVar18 = ringbuffer_local;
        uVar6 = (uint)sr.score;
        if (sr2.distance < sr.distance + 0xaf) goto LAB_0011b593;
        puVar18 = ringbuffer_local + 1;
        pos_end = pos_end + 1;
        sStack_ca0 = distance_code;
        sr.len = sr2.len;
        sr.distance = sr2.distance;
        sr.score = (size_t)(uint)sr2.score;
        cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
        uVar6 = (uint)sr2.score;
        if ((3 < cost_diff_lazy._4_4_) ||
           (puVar13 = ringbuffer_local + 5, ringbuffer_local = puVar18, puVar10 <= puVar13))
        goto LAB_0011b593;
      } while( true );
    }
    pos_end = pos_end + 1;
    puVar18 = ringbuffer_local + 1;
    if (gap < puVar18) {
      if ((uint8_t *)(gap + lVar11 * 4) < puVar18) {
        puVar13 = ringbuffer_local + 0x11;
        local_d78 = puVar10 + -4;
        ringbuffer_local = puVar18;
        if (puVar13 < local_d78) {
          local_d78 = puVar13;
        }
        for (; puVar18 = ringbuffer_local, ringbuffer_local < local_d78;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar6 = (uint)(*(int *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) *
                        0x1e35a7bd) >> 0x11;
          uVar12 = (ulong)uVar6;
          uVar19 = uVar12 & 0x1ff;
          uVar1 = *(ushort *)(hasher + uVar19 * 2 + 0x140028);
          *(ushort *)(hasher + uVar19 * 2 + 0x140028) = uVar1 + 1;
          uVar7 = uVar1 & 0x1ff;
          local_168 = (long)ringbuffer_local - (ulong)*(uint *)(hasher + uVar12 * 4 + 0x28);
          hasher[((ulong)ringbuffer_local & 0xffff) + 0x30028] = (uint8_t)uVar6;
          if (0xffff < local_168) {
            local_168 = 0xffff;
          }
          *(short *)(hasher + (long)(int)uVar7 * 4 + uVar19 * 0x800 + 0x40028) = (short)local_168;
          *(undefined2 *)(hasher + (long)(int)uVar7 * 4 + uVar19 * 0x800 + 0x4002a) =
               *(undefined2 *)(hasher + uVar12 * 2 + 0x20028);
          *(int *)(hasher + uVar12 * 4 + 0x28) = (int)ringbuffer_local;
          *(short *)(hasher + uVar12 * 2 + 0x20028) = (short)uVar7;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar13 = ringbuffer_local + 9;
        local_d88 = puVar10 + -3;
        ringbuffer_local = puVar18;
        if (puVar13 < local_d88) {
          local_d88 = puVar13;
        }
        for (; puVar18 = ringbuffer_local, ringbuffer_local < local_d88;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar6 = (uint)(*(int *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) *
                        0x1e35a7bd) >> 0x11;
          uVar12 = (ulong)uVar6;
          uVar19 = uVar12 & 0x1ff;
          uVar1 = *(ushort *)(hasher + uVar19 * 2 + 0x140028);
          *(ushort *)(hasher + uVar19 * 2 + 0x140028) = uVar1 + 1;
          uVar7 = uVar1 & 0x1ff;
          local_1b0 = (long)ringbuffer_local - (ulong)*(uint *)(hasher + uVar12 * 4 + 0x28);
          hasher[((ulong)ringbuffer_local & 0xffff) + 0x30028] = (uint8_t)uVar6;
          if (0xffff < local_1b0) {
            local_1b0 = 0xffff;
          }
          *(short *)(hasher + (long)(int)uVar7 * 4 + uVar19 * 0x800 + 0x40028) = (short)local_1b0;
          *(undefined2 *)(hasher + (long)(int)uVar7 * 4 + uVar19 * 0x800 + 0x4002a) =
               *(undefined2 *)(hasher + uVar12 * 2 + 0x20028);
          *(int *)(hasher + uVar12 * 4 + 0x28) = (int)ringbuffer_local;
          *(short *)(hasher + uVar12 * 2 + 0x20028) = (short)uVar7;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
LAB_0011924b:
  local_4b8 = local_4b8 + 1;
  limit2 = limit2 + 8;
  goto LAB_001191e9;
LAB_00119710:
  local_4f8 = local_4f8 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_001196ae;
LAB_00119e38:
  local_318 = local_318 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00119dd6;
LAB_0011a5ab:
  local_820 = local_820 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_0011a549;
LAB_0011b198:
  local_680 = local_680 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_0011b136;
LAB_0011b593:
  sr.score._0_4_ = uVar6;
  ringbuffer_local = puVar18;
  gap = (size_t)(ringbuffer_local + lVar11 + sStack_ca0 * 2);
  local_d38 = puVar9;
  if (ringbuffer_local < puVar9) {
    local_d38 = ringbuffer_local;
  }
  if (sr.len <= local_d38) {
    uVar12 = (sr.len + 3) - (long)*dist_cache;
    uVar19 = (sr.len + 3) - (long)dist_cache[1];
    if (sr.len == (long)*dist_cache) {
      local_b40 = 0;
      goto LAB_0011b7b6;
    }
    if (sr.len == (long)dist_cache[1]) {
      local_b40 = 1;
      goto LAB_0011b7b6;
    }
    if (uVar12 < 7) {
      local_b40 = (ulong)(int)(0x9750468 >> ((byte)((uVar12 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_0011b7b6;
    }
    if (uVar19 < 7) {
      local_b40 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar19 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_0011b7b6;
    }
    if (sr.len == (long)dist_cache[2]) {
      local_b40 = 2;
      goto LAB_0011b7b6;
    }
    if (sr.len == (long)dist_cache[3]) {
      local_b40 = 3;
      goto LAB_0011b7b6;
    }
  }
  local_b40 = sr.len + 0xf;
LAB_0011b7b6:
  if ((sr.len <= local_d38) && (local_b40 != 0)) {
    dist_cache[3] = dist_cache[2];
    dist_cache[2] = dist_cache[1];
    dist_cache[1] = *dist_cache;
    *dist_cache = (int)sr.len;
    iVar8 = *dist_cache;
    dist_cache[4] = iVar8 + -1;
    dist_cache[5] = iVar8 + 1;
    dist_cache[6] = iVar8 + -2;
    dist_cache[7] = iVar8 + 2;
    dist_cache[8] = iVar8 + -3;
    dist_cache[9] = iVar8 + 3;
    iVar8 = dist_cache[1];
    dist_cache[10] = iVar8 + -1;
    dist_cache[0xb] = iVar8 + 1;
    dist_cache[0xc] = iVar8 + -2;
    dist_cache[0xd] = iVar8 + 2;
    dist_cache[0xe] = iVar8 + -3;
    dist_cache[0xf] = iVar8 + 3;
  }
  uVar22 = (uint32_t)pos_end;
  commands->insert_len_ = uVar22;
  commands->copy_len_ = (uint)sStack_ca0 | (uint)sr.score << 0x19;
  uVar6 = (params->dist).num_direct_distance_codes;
  uVar7 = (params->dist).distance_postfix_bits;
  if (local_b40 < (ulong)uVar6 + 0x10) {
    commands->dist_prefix_ = (uint16_t)local_b40;
    commands->dist_extra_ = 0;
  }
  else {
    bVar3 = (byte)uVar7;
    uVar12 = (1L << (bVar3 + 2 & 0x3f)) + ((local_b40 - 0x10) - (ulong)uVar6);
    iVar8 = 0x1f;
    if ((uint)uVar12 != 0) {
      for (; (uint)uVar12 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    bVar21 = (byte)(iVar8 - 1U);
    uVar19 = uVar12 >> (bVar21 & 0x3f) & 1;
    lVar20 = (ulong)(iVar8 - 1U) - (ulong)uVar7;
    commands->dist_prefix_ =
         (short)lVar20 * 0x400 |
         (short)uVar6 + 0x10 + (short)((lVar20 + -1) * 2 + uVar19 << (bVar3 & 0x3f)) +
         ((ushort)uVar12 & (short)(1 << (bVar3 & 0x1f)) - 1U);
    commands->dist_extra_ = (uint32_t)(uVar12 - (uVar19 + 2 << (bVar21 & 0x3f)) >> (bVar3 & 0x3f));
  }
  iVar8 = (uint)sStack_ca0 + (uint)sr.score;
  uVar12 = (ulong)iVar8;
  if (pos_end < 6) {
    local_a2a = (ushort)pos_end;
  }
  else if (pos_end < 0x82) {
    iVar2 = 0x1f;
    if (uVar22 - 2 != 0) {
      for (; uVar22 - 2 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    local_a2a = (short)(iVar2 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar2 + -1) & 0x3f)) + 2;
  }
  else if (pos_end < 0x842) {
    iVar2 = 0x1f;
    if (uVar22 - 0x42 != 0) {
      for (; uVar22 - 0x42 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    local_a2a = (short)iVar2 + 10;
  }
  else if (pos_end < 0x1842) {
    local_a2a = 0x15;
  }
  else if (pos_end < 0x5842) {
    local_a2a = 0x16;
  }
  else {
    local_a2a = 0x17;
  }
  if (uVar12 < 10) {
    local_a02 = (short)iVar8 - 2;
  }
  else if (uVar12 < 0x86) {
    iVar2 = 0x1f;
    if (iVar8 - 6U != 0) {
      for (; iVar8 - 6U >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    local_a02 = (short)(iVar2 + -1) * 2 + (short)(uVar12 - 6 >> ((byte)(iVar2 + -1) & 0x3f)) + 4;
  }
  else if (uVar12 < 0x846) {
    iVar2 = 0x1f;
    if (iVar8 - 0x46U != 0) {
      for (; iVar8 - 0x46U >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    local_a02 = (short)iVar2 + 0xc;
  }
  else {
    local_a02 = 0x17;
  }
  local_9da = local_a02 & 7 | (local_a2a & 7) << 3;
  if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_a2a < 8)) && (local_a02 < 0x10)) {
    if (7 < local_a02) {
      local_9da = local_9da | 0x40;
    }
  }
  else {
    iVar8 = ((int)(uint)local_a02 >> 3) + ((int)(uint)local_a2a >> 3) * 3;
    local_9da = (short)iVar8 * 0x40 + 0x40 +
                ((ushort)(0x520d40 >> ((char)iVar8 * '\x02' & 0x1fU)) & 0xc0) | local_9da;
  }
  commands->cmd_prefix_ = local_9da;
  *num_literals = pos_end + *num_literals;
  pos_end = 0;
  range_end = (size_t)(ringbuffer_local + 2);
  local_d50 = ringbuffer_local + sStack_ca0;
  if (local_d10 <= local_d50) {
    local_d50 = local_d10;
  }
  if (sr.len < sStack_ca0 >> 2) {
    local_d60 = ringbuffer_local + sr.len * -4 + sStack_ca0;
    if (local_d60 < range_end) {
      local_d60 = (uint8_t *)range_end;
    }
    if (local_d50 < local_d60) {
      local_d68 = local_d50;
    }
    else {
      local_d68 = local_d60;
    }
    range_end = (size_t)local_d68;
  }
  for (local_2b8 = (uint8_t *)range_end; local_2b8 < local_d50; local_2b8 = local_2b8 + 1) {
    uVar6 = (uint)(*(int *)(ringbuffer + ((ulong)local_2b8 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11
    ;
    uVar12 = (ulong)uVar6;
    uVar19 = uVar12 & 0x1ff;
    uVar1 = *(ushort *)(hasher + uVar19 * 2 + 0x140028);
    *(ushort *)(hasher + uVar19 * 2 + 0x140028) = uVar1 + 1;
    uVar7 = uVar1 & 0x1ff;
    local_288 = (long)local_2b8 - (ulong)*(uint *)(hasher + uVar12 * 4 + 0x28);
    hasher[((ulong)local_2b8 & 0xffff) + 0x30028] = (uint8_t)uVar6;
    if (0xffff < local_288) {
      local_288 = 0xffff;
    }
    *(short *)(hasher + (long)(int)uVar7 * 4 + uVar19 * 0x800 + 0x40028) = (short)local_288;
    *(undefined2 *)(hasher + (long)(int)uVar7 * 4 + uVar19 * 0x800 + 0x4002a) =
         *(undefined2 *)(hasher + uVar12 * 2 + 0x20028);
    *(int *)(hasher + uVar12 * 4 + 0x28) = (int)local_2b8;
    *(short *)(hasher + uVar12 * 2 + 0x20028) = (short)uVar7;
  }
  commands = commands + 1;
  puVar18 = ringbuffer_local + sStack_ca0;
  goto LAB_00118eb9;
LAB_0011aa70:
  local_860 = local_860 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_0011aa0e;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}